

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall
MT32Emu::RendererImpl<float>::produceLA32Output
          (RendererImpl<float> *this,FloatSample *buffer,Bit32u len)

{
  DACInputMode DVar1;
  float fVar2;
  Bit32u local_1c;
  FloatSample *pFStack_18;
  Bit32u len_local;
  FloatSample *buffer_local;
  RendererImpl<float> *this_local;
  
  DVar1 = Synth::getDACInputMode((this->super_Renderer).synth);
  local_1c = len;
  pFStack_18 = buffer;
  if (DVar1 == DACInputMode_NICE) {
    while (local_1c != 0) {
      *pFStack_18 = *pFStack_18 * 2.0;
      pFStack_18 = pFStack_18 + 1;
      local_1c = local_1c - 1;
    }
  }
  else if (DVar1 == DACInputMode_GENERATION2) {
    while (local_1c != 0) {
      fVar2 = produceDistortedSample(*pFStack_18 * 2.0);
      *pFStack_18 = fVar2;
      pFStack_18 = pFStack_18 + 1;
      local_1c = local_1c - 1;
    }
  }
  return;
}

Assistant:

void RendererImpl<FloatSample>::produceLA32Output(FloatSample *buffer, Bit32u len) {
	switch (synth.getDACInputMode()) {
	case DACInputMode_NICE:
		// Note, we do not do any clamping for floats here to avoid introducing distortions.
		// This means that the output signal may actually overshoot the unity when the volume is set too high.
		// We leave it up to the consumer whether the output is to be clamped or properly normalised further on.
		while (len--) {
			*buffer *= 2.0f;
			buffer++;
		}
		break;
	case DACInputMode_GENERATION2:
		while (len--) {
			*buffer = produceDistortedSample(2.0f * *buffer);
			buffer++;
		}
		break;
	default:
		break;
	}
}